

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIO.cpp
# Opt level: O2

string * highsBoolToString_abi_cxx11_(string *__return_storage_ptr__,bool b,HighsInt field_width)

{
  uint uVar1;
  char *pcVar2;
  allocator *paVar3;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  uVar1 = -field_width;
  if (0 < field_width) {
    uVar1 = field_width;
  }
  if (uVar1 < 2) {
    pcVar2 = "F";
    if (b) {
      pcVar2 = "T";
    }
    paVar3 = &local_9;
  }
  else if (uVar1 == 2) {
    pcVar2 = "false";
    if (b) {
      pcVar2 = "true";
    }
    paVar3 = &local_a;
  }
  else if (field_width < 0) {
    pcVar2 = "false";
    if (b) {
      pcVar2 = "true ";
    }
    paVar3 = &local_b;
  }
  else {
    pcVar2 = "false";
    if (b) {
      pcVar2 = " true";
    }
    paVar3 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar3);
  return __return_storage_ptr__;
}

Assistant:

const std::string highsBoolToString(const bool b, const HighsInt field_width) {
  const HighsInt abs_field_width = std::abs(field_width);
  if (abs_field_width <= 1) return b ? "T" : "F";
  if (abs_field_width <= 2) return b ? "true" : "false";
  if (field_width < 0) return b ? "true " : "false";
  return b ? " true" : "false";
}